

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_samtools.c
# Opt level: O0

bam_hdr_t * cram_header_to_bam(SAM_hdr *h)

{
  bam_hdr_t *pbVar1;
  size_t sVar2;
  char *pcVar3;
  char *__src;
  char **ppcVar4;
  uint32_t *puVar5;
  bam_hdr_t *header;
  int i;
  SAM_hdr *h_local;
  
  pbVar1 = bam_hdr_init();
  sVar2 = ks_len(&h->text);
  pbVar1->l_text = (uint32_t)sVar2;
  pcVar3 = (char *)malloc((ulong)(pbVar1->l_text + 1));
  pbVar1->text = pcVar3;
  pcVar3 = pbVar1->text;
  __src = ks_str(&h->text);
  memcpy(pcVar3,__src,(ulong)pbVar1->l_text);
  pbVar1->text[pbVar1->l_text] = '\0';
  pbVar1->n_targets = h->nref;
  ppcVar4 = (char **)calloc((long)pbVar1->n_targets,8);
  pbVar1->target_name = ppcVar4;
  puVar5 = (uint32_t *)calloc((long)pbVar1->n_targets,4);
  pbVar1->target_len = puVar5;
  for (header._4_4_ = 0; header._4_4_ < h->nref; header._4_4_ = header._4_4_ + 1) {
    pcVar3 = strdup(h->ref[header._4_4_].name);
    pbVar1->target_name[header._4_4_] = pcVar3;
    pbVar1->target_len[header._4_4_] = h->ref[header._4_4_].len;
  }
  return pbVar1;
}

Assistant:

bam_hdr_t *cram_header_to_bam(SAM_hdr *h) {
    int i;
    bam_hdr_t *header = bam_hdr_init();

    header->l_text = ks_len(&h->text);
    header->text = malloc(header->l_text+1);
    memcpy(header->text, ks_str(&h->text), header->l_text);
    header->text[header->l_text] = 0;

    header->n_targets = h->nref;
    header->target_name = (char **)calloc(header->n_targets,
					  sizeof(char *));
    header->target_len = (uint32_t *)calloc(header->n_targets, 4);

    for (i = 0; i < h->nref; i++) {
	header->target_name[i] = strdup(h->ref[i].name);
	header->target_len[i] = h->ref[i].len;
    }

    return header;
}